

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O0

SquareMatrix<3> * pbrt::ConvertRGBColorSpace(RGBColorSpace *from,RGBColorSpace *to)

{
  bool bVar1;
  RGBColorSpace *in_RDX;
  RGBColorSpace *in_RDI;
  SquareMatrix<3> *in_stack_00000058;
  SquareMatrix<3> *in_stack_00000060;
  RGBColorSpace *pRVar2;
  
  pRVar2 = in_RDI;
  bVar1 = RGBColorSpace::operator==(in_RDX,in_RDI);
  if (bVar1) {
    SquareMatrix<3>::SquareMatrix((SquareMatrix<3> *)in_RDI);
  }
  else {
    operator*(in_stack_00000060,in_stack_00000058);
  }
  return (SquareMatrix<3> *)pRVar2;
}

Assistant:

SquareMatrix<3> ConvertRGBColorSpace(const RGBColorSpace &from, const RGBColorSpace &to) {
    if (from == to)
        return {};
    return to.RGBFromXYZ * from.XYZFromRGB;
}